

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::update_clause_weights(ls_solver *this)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  iterator this_00;
  reference piVar4;
  reference pvVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  int v;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  ls_solver *in_stack_00000030;
  int c;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_30;
  int local_24;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_10;
  
  local_10 = in_RDI + 0xd;
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  local_20 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffffa8), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_18);
    local_24 = *piVar4;
    pvVar2 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                       ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 7),
                        (long)local_24);
    pvVar2->weight = pvVar2->weight + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_18);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x13));
  in_RDI[0x25]._M_current = (int *)(sVar3 + (long)in_RDI[0x25]._M_current);
  local_30 = in_RDI + 0x13;
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)in_stack_ffffffffffffffa8), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    iVar6 = *piVar4;
    pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                       ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 4),
                        (long)iVar6);
    in_stack_ffffffffffffffa8 = (vector<int,_std::allocator<int>_> *)(long)pvVar5->unsat_appear;
    pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                       ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 4),
                        (long)iVar6);
    pvVar5->score =
         (long)&(in_stack_ffffffffffffffa8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start + pvVar5->score;
    pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                       ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 4),
                        (long)iVar6);
    if (((0 < pvVar5->score) &&
        (pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                            ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 4)
                             ,(long)iVar6), (pvVar5->cc_value & 1U) == 1)) &&
       (pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                           ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 4),
                            (long)iVar6), (pvVar5->is_in_ccd_vars & 1U) == 0)) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this_00._M_current,
                 (value_type_conflict1 *)CONCAT44(iVar6,in_stack_ffffffffffffffb8));
      pvVar5 = std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                         ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 4),
                          (long)iVar6);
      pvVar5->is_in_ccd_vars = true;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd));
  in_RDI[0x165]._M_current = (int *)(sVar3 + (long)in_RDI[0x165]._M_current);
  if (in_RDI[0xb]._M_current <= in_RDI[0x165]._M_current) {
    *(int *)&in_RDI[0x164]._M_current = *(int *)&in_RDI[0x164]._M_current + 1;
    in_RDI[0x165]._M_current =
         (int *)((long)in_RDI[0x165]._M_current - (long)in_RDI[0xb]._M_current);
    if (*(int *)((long)&in_RDI[0x162]._M_current + 4) < *(int *)&in_RDI[0x164]._M_current) {
      smooth_clause_weights(in_stack_00000030);
    }
  }
  return;
}

Assistant:

void ls_solver::update_clause_weights()
{
    for (int c : _unsat_clauses) {
        _clauses[c].weight++;
    }
    _mems += _unsat_vars.size();
    for (int v : _unsat_vars) {
        _vars[v].score += _vars[v].unsat_appear;
        if (_vars[v].score > 0 && 1 == _vars[v].cc_value && !(_vars[v].is_in_ccd_vars)) {
            _ccd_vars.push_back(v);
            _vars[v].is_in_ccd_vars = 1;
        }
    }
    _delta_total_clause_weight += _unsat_clauses.size();
    if (_delta_total_clause_weight >= _num_clauses) {
        _avg_clause_weight += 1;
        _delta_total_clause_weight -= _num_clauses;
        if (_avg_clause_weight > _swt_threshold) {
            smooth_clause_weights();
        }
    }
}